

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O2

t_object * xemmai::t_module::f_load_script(wstring_view a_path)

{
  _Elt_pointer *a_debug;
  _Elt_pointer *pptVar1;
  t_object *ptVar2;
  t_engine *this;
  t_type_of<xemmai::t_object> *this_00;
  t_queue<128UL> *this_01;
  t_queue<256UL> *this_02;
  wstring_view a_string;
  FILE *a_stream;
  t_script *ptVar3;
  t_object *ptVar4;
  long in_FS_OFFSET;
  unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> close;
  unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> local_288;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_278;
  t_script *local_268;
  _Alloc_hider in_stack_fffffffffffffda0;
  t_scope *in_stack_fffffffffffffda8;
  t_scope local_1a8;
  
  a_string._M_str = (wchar_t *)in_stack_fffffffffffffda8;
  a_string._M_len = (size_t)in_stack_fffffffffffffda0._M_p;
  portable::f_convert_abi_cxx11_(a_string);
  a_stream = fopen((char *)local_1a8.v_outer,"r");
  std::__cxx11::string::~string((string *)&local_1a8);
  if (a_stream == (FILE *)0x0) {
    ptVar4 = (t_object *)0x0;
  }
  else {
    local_1a8.v_references._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1a8.v_references._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1a8.v_references._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_288._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
    super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
    super__Tuple_impl<1UL,_int_(*)(_IO_FILE_*)>.super__Head_base<1UL,_int_(*)(_IO_FILE_*),_false>.
    _M_head_impl = (_Head_base<1UL,_int_(*)(_IO_FILE_*),_false>)fclose;
    local_1a8.v_references._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a8.v_outer = (t_scope *)0x0;
    local_1a8.v_block.
    super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.v_block.
    super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.v_block.
    super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.v_shared = false;
    local_1a8.v_self_shared = false;
    local_1a8.v_references._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1a8.v_unresolveds._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1a8.v_unresolveds._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1a8.v_unresolveds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1a8.v_unresolveds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a8.v_unresolveds._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1a8.v_variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1a8.v_variables._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1a8.v_variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1a8.v_variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a8.v_junction.v_privates.
    super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.v_junction.v_privates.
    super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.v_junction.v_privates.
    super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.v_junction.v_previouses.
    super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.v_junction.v_previouses.
    super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.v_junction.v_previouses.
    super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.v_junction.v_nexts.
    super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.v_junction.v_nexts.
    super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.v_junction.v_nexts.
    super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.v_shareds = 0;
    local_1a8.v_block_block.v_queue = (t_block *)0x0;
    local_1a8.v_block_block.v_forward = false;
    local_1a8.v_block_block.v_backward = false;
    local_1a8.v_privates.
    super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.v_privates.
    super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.v_variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1a8.v_privates.
    super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.v_block_block.v_privates.
    super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.v_block_block.v_privates.
    super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.v_block_block.v_privates.
    super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.v_block_block.v_previouses.
    super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.v_block_block.v_previouses.
    super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.v_block_block.v_previouses.
    super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.v_junction.v_forward = false;
    local_1a8.v_junction.v_backward = false;
    local_1a8.v_block_block.v_nexts.
    super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.v_block_block.v_nexts.
    super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.v_block_block.v_nexts.
    super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.v_junction.v_queue = (t_block *)0x0;
    this = *(t_engine **)(in_FS_OFFSET + -0x60);
    this_00 = *(t_type_of<xemmai::t_object> **)(*(long *)(in_FS_OFFSET + -0x78) + 0x78);
    local_288._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
    super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>
    ._M_head_impl = (_IO_FILE *)a_stream;
    local_1a8.v_references._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1a8.v_references._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1a8.v_unresolveds._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1a8.v_unresolveds._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1a8.v_variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1a8.v_variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (this->v_debugger == (t_debugger *)0x0) {
      ptVar3 = (t_script *)
               t_type_of<xemmai::t_object>::
               f_new<xemmai::t_script,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>&>
                         (this_00,&local_278);
      t_parser::t_parser((t_parser *)&local_268,
                         (t_script *)
                         &(ptVar3->v_slots).
                          super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl
                          .super__Deque_impl_data._M_start._M_last,(FILE *)a_stream);
      t_parser::operator()((t_parser *)&local_268,&local_1a8);
      std::__cxx11::wstring::~wstring((wstring *)&stack0xfffffffffffffda0);
      local_268 = ptVar3;
      ptVar4 = t_emit::operator()((t_emit *)&local_268,&local_1a8);
    }
    else {
      ptVar3 = (t_script *)
               t_type_of<xemmai::t_object>::
               f_new<xemmai::t_debug_script,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>&>
                         (this_00,&local_278);
      a_debug = &(ptVar3->v_slots).
                 super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last;
      t_parser::t_parser((t_parser *)&local_268,(t_script *)a_debug,(FILE *)a_stream);
      t_parser::operator()((t_parser *)&local_268,&local_1a8);
      std::__cxx11::wstring::~wstring((wstring *)&stack0xfffffffffffffda0);
      local_268 = ptVar3;
      ptVar4 = t_emit::operator()((t_emit *)&local_268,&local_1a8);
      if ((t_object *)0x4 < ptVar4) {
        this_01 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
        *this_01->v_head = ptVar4;
        if (this_01->v_head == this_01->v_next) {
          t_slot::t_queue<128UL>::f_next(this_01);
        }
        else {
          this_01->v_head = this_01->v_head + 1;
        }
      }
      LOCK();
      pptVar1 = &ptVar3[1].v_slots.
                 super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last;
      ptVar2 = (t_object *)*pptVar1;
      *pptVar1 = (_Elt_pointer)ptVar4;
      UNLOCK();
      if ((t_object *)0x4 < ptVar2) {
        this_02 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
        *this_02->v_head = ptVar2;
        if (this_02->v_head == this_02->v_next) {
          t_slot::t_queue<256UL>::f_next(this_02);
        }
        else {
          this_02->v_head = this_02->v_head + 1;
        }
      }
      t_engine::f_debug_script_loaded(this,(t_debug_script *)a_debug);
      ptVar4 = (t_object *)
               ptVar3[1].v_slots.super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
    }
    ast::t_scope::~t_scope(&local_1a8);
    std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::~unique_ptr(&local_288);
  }
  return ptVar4;
}

Assistant:

t_object* t_module::f_load_script(std::wstring_view a_path)
{
	auto stream = std::fopen(portable::f_convert(a_path).c_str(), "r");
	if (!stream) return nullptr;
	std::unique_ptr<std::FILE, int(*)(std::FILE*)> close(stream, std::fclose);
	ast::t_scope scope(nullptr);
	if (auto engine = f_engine(); engine->v_debugger) {
		auto body = f_global()->f_type<t_module::t_body>()->f_new<t_debug_script>(a_path);
		auto& script = body->f_as<t_debug_script>();
		t_parser(script, stream)(scope);
		script.v_code = t_emit(body, &script.v_safe_points)(scope);
		engine->f_debug_script_loaded(script);
		return script.v_code;
	} else {
		auto body = f_global()->f_type<t_module::t_body>()->f_new<t_script>(a_path);
		t_parser(body->f_as<t_script>(), stream)(scope);
		return t_emit(body, nullptr)(scope);
	}
}